

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[5],kj::String,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [5],String *params_1,
          char (*params_2) [3])

{
  ArrayPtr<const_char> local_70;
  StringTree local_60;
  ArrayPtr<const_char> local_28;
  
  local_70 = toCharSequence<char_const(&)[5]>((char (*) [5])this);
  local_60.text.content.size_ = *(size_t *)(params[1] + 3);
  local_60.size_ = (size_t)(undefined1 *)0x0;
  if ((Branch *)local_60.text.content.size_ != (Branch *)0x0) {
    local_60.size_ =
         (size_t)((long)&(((Branch *)(local_60.text.content.size_ + -0x40))->content).branches.
                         disposer + 7);
  }
  local_60.text.content.ptr = *(char **)params;
  local_60.text.content.disposer = *(ArrayDisposer **)(params[3] + 1);
  *(undefined8 *)params = 0;
  *(undefined8 *)(params[1] + 3) = 0;
  local_60.branches.ptr = (Branch *)0x0;
  local_60.branches.size_ = 0;
  local_60.branches.disposer = (ArrayDisposer *)0x0;
  local_28 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_70,(ArrayPtr<const_char> *)&local_60,
             (StringTree *)&local_28,(ArrayPtr<const_char> *)params_2);
  StringTree::~StringTree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}